

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hittable.h
# Opt level: O1

void __thiscall translate::translate(translate *this,shared_ptr<hittable> *object,vec3 *offset)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  double dVar8;
  double local_40;
  double local_38;
  double local_30;
  double local_28;
  double local_20;
  double local_18;
  
  (this->super_hittable)._vptr_hittable = (_func_int **)&PTR__translate_00129c38;
  (this->object).super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (object->super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  p_Var1 = (object->super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi;
  (this->object).super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = p_Var1
  ;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
    }
  }
  (this->offset).e[2] = offset->e[2];
  uVar2 = *(undefined4 *)((long)offset->e + 4);
  uVar3 = *(undefined4 *)(offset->e + 1);
  uVar4 = *(undefined4 *)((long)offset->e + 0xc);
  *(undefined4 *)(this->offset).e = *(undefined4 *)offset->e;
  *(undefined4 *)((long)(this->offset).e + 4) = uVar2;
  *(undefined4 *)((this->offset).e + 1) = uVar3;
  *(undefined4 *)((long)(this->offset).e + 0xc) = uVar4;
  (this->bbox).x.min = INFINITY;
  (this->bbox).x.max = -INFINITY;
  (this->bbox).y.min = INFINITY;
  (this->bbox).y.max = -INFINITY;
  (this->bbox).z.min = INFINITY;
  (this->bbox).z.max = -INFINITY;
  (*((object->super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->_vptr_hittable[3])
            (&local_40);
  local_40 = local_40 + offset->e[0];
  local_38 = offset->e[0] + local_38;
  local_30 = local_30 + offset->e[1];
  local_28 = offset->e[1] + local_28;
  dVar8 = local_38 - local_40;
  if (dVar8 < 0.0001) {
    local_38 = local_38 + 5e-05;
  }
  local_20 = local_20 + offset->e[2];
  local_18 = offset->e[2] + local_18;
  uVar5 = -(ulong)(dVar8 < 0.0001);
  dVar8 = local_28 - local_30;
  if (dVar8 < 0.0001) {
    local_28 = local_28 + 5e-05;
  }
  uVar6 = -(ulong)(dVar8 < 0.0001);
  dVar8 = local_18 - local_20;
  if (dVar8 < 0.0001) {
    local_18 = local_18 + 5e-05;
  }
  uVar7 = -(ulong)(dVar8 < 0.0001);
  (this->bbox).x.min = (double)(~uVar5 & (ulong)local_40 | (ulong)(local_40 + -5e-05) & uVar5);
  (this->bbox).x.max = local_38;
  (this->bbox).y.min = (double)(~uVar6 & (ulong)local_30 | (ulong)(local_30 + -5e-05) & uVar6);
  (this->bbox).y.max = local_28;
  (this->bbox).z.min = (double)(~uVar7 & (ulong)local_20 | (ulong)(local_20 + -5e-05) & uVar7);
  (this->bbox).z.max = local_18;
  return;
}

Assistant:

translate(shared_ptr<hittable> object, const vec3& offset)
      : object(object), offset(offset)
    {
        bbox = object->bounding_box() + offset;
    }